

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

block * gen_ecode(compiler_state_t *cstate,u_char *eaddr,qual q)

{
  uint uVar1;
  int iVar2;
  block *pbVar3;
  block *b1;
  uint uVar4;
  char *fmt;
  
  if (((uint)q & 0xfffe) == 0x100) {
    uVar4 = (uint)q >> 0x10;
    iVar2 = cstate->linktype;
    if (iVar2 < 0x69) {
      if (iVar2 == 1) {
LAB_0010eaf6:
        pbVar3 = gen_prevlinkhdr_check(cstate);
        b1 = gen_ehostop(cstate,eaddr,uVar4 & 0xff);
        if (pbVar3 != (block *)0x0) {
          gen_and(pbVar3,b1);
        }
        return b1;
      }
      if (iVar2 == 6) {
        pbVar3 = gen_thostop(cstate,eaddr,uVar4 & 0xff);
        return pbVar3;
      }
      if (iVar2 == 10) {
        pbVar3 = gen_fhostop(cstate,eaddr,uVar4 & 0xff);
        return pbVar3;
      }
    }
    else {
      uVar1 = iVar2 - 0x69;
      if (uVar1 < 0x3b) {
        if ((0x400000000404001U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_0010ea9a;
        if ((ulong)uVar1 == 0x11) {
          pbVar3 = gen_ipfchostop(cstate,eaddr,uVar4 & 0xff);
          return pbVar3;
        }
      }
      if (iVar2 - 0xf0U < 2) goto LAB_0010eaf6;
      if (iVar2 == 0xc0) {
LAB_0010ea9a:
        pbVar3 = gen_wlanhostop(cstate,eaddr,uVar4 & 0xff);
        return pbVar3;
      }
    }
    fmt = 
    "ethernet addresses supported only on ethernet/FDDI/token ring/802.11/ATM LANE/Fibre Channel";
  }
  else {
    fmt = "ethernet address used in non-ether expression";
  }
  bpf_error(cstate,fmt);
}

Assistant:

struct block *
gen_ecode(compiler_state_t *cstate, const u_char *eaddr, struct qual q)
{
	struct block *b, *tmp;

	if ((q.addr == Q_HOST || q.addr == Q_DEFAULT) && q.proto == Q_LINK) {
		switch (cstate->linktype) {
		case DLT_EN10MB:
		case DLT_NETANALYZER:
		case DLT_NETANALYZER_TRANSPARENT:
			tmp = gen_prevlinkhdr_check(cstate);
			b = gen_ehostop(cstate, eaddr, (int)q.dir);
			if (tmp != NULL)
				gen_and(tmp, b);
			return b;
		case DLT_FDDI:
			return gen_fhostop(cstate, eaddr, (int)q.dir);
		case DLT_IEEE802:
			return gen_thostop(cstate, eaddr, (int)q.dir);
		case DLT_IEEE802_11:
		case DLT_PRISM_HEADER:
		case DLT_IEEE802_11_RADIO_AVS:
		case DLT_IEEE802_11_RADIO:
		case DLT_PPI:
			return gen_wlanhostop(cstate, eaddr, (int)q.dir);
		case DLT_IP_OVER_FC:
			return gen_ipfchostop(cstate, eaddr, (int)q.dir);
		default:
			bpf_error(cstate, "ethernet addresses supported only on ethernet/FDDI/token ring/802.11/ATM LANE/Fibre Channel");
			break;
		}
	}
	bpf_error(cstate, "ethernet address used in non-ether expression");
	/* NOTREACHED */
	return NULL;
}